

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall GdlSetAttrItem::FixFeatureTestsInRules(GdlSetAttrItem *this,GrcFont *pfont)

{
  GdlExpression *pGVar1;
  pointer ppGVar2;
  ulong uVar3;
  
  pGVar1 = (this->super_GdlRuleItem).m_pexpConstraint;
  if (pGVar1 != (GdlExpression *)0x0) {
    (*pGVar1->_vptr_GdlExpression[0xc])(pGVar1,pfont);
    pGVar1 = (this->super_GdlRuleItem).m_pexpConstraint;
    (*pGVar1->_vptr_GdlExpression[0xe])(pGVar1,0,0);
  }
  ppGVar2 = (this->m_vpavs).
            super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppGVar2) {
    uVar3 = 0;
    do {
      (*ppGVar2[uVar3]->m_pexpValue->_vptr_GdlExpression[0xc])(ppGVar2[uVar3]->m_pexpValue,pfont);
      uVar3 = uVar3 + 1;
      ppGVar2 = (this->m_vpavs).
                super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->m_vpavs).
                                   super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3))
    ;
  }
  return;
}

Assistant:

void GdlSetAttrItem::FixFeatureTestsInRules(GrcFont * pfont)
{
	GdlRuleItem::FixFeatureTestsInRules(pfont);

	for (size_t iavs = 0; iavs < this->m_vpavs.size(); iavs++)
		m_vpavs[iavs]->FixFeatureTestsInRules(pfont);
}